

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAxisSweep3Internal.h
# Opt level: O3

unsigned_short __thiscall
cbtAxisSweep3Internal<unsigned_short>::addHandle
          (cbtAxisSweep3Internal<unsigned_short> *this,cbtVector3 *aabbMin,cbtVector3 *aabbMax,
          void *pOwner,int collisionFilterGroup,int collisionFilterMask,cbtDispatcher *dispatcher)

{
  Handle *pHVar1;
  uint uVar2;
  short *psVar3;
  ushort uVar4;
  long lVar5;
  ushort uVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  unsigned_short min [3];
  unsigned_short local_3c [6];
  
  lVar9 = 0;
  quantize(this,local_3c + 3,aabbMin,0);
  quantize(this,local_3c,aabbMax,1);
  uVar4 = this->m_firstFreeHandle;
  pHVar1 = this->m_pHandles + uVar4;
  this->m_firstFreeHandle = *(unsigned_short *)&(pHVar1->super_cbtBroadphaseProxy).field_0x34;
  uVar2 = *(int *)&this->m_numHandles * 2 + 2;
  this->m_numHandles = (short)*(int *)&this->m_numHandles + 1;
  (pHVar1->super_cbtBroadphaseProxy).m_uniqueId = (uint)uVar4;
  (pHVar1->super_cbtBroadphaseProxy).m_clientObject = pOwner;
  (pHVar1->super_cbtBroadphaseProxy).m_collisionFilterGroup = collisionFilterGroup;
  (pHVar1->super_cbtBroadphaseProxy).m_collisionFilterMask = collisionFilterMask;
  uVar6 = (ushort)uVar2;
  iVar7 = (uVar2 & 0xffff) - 1;
  lVar8 = (long)iVar7;
  do {
    psVar3 = (short *)((long)this->m_pHandles->m_maxEdges + lVar9);
    *psVar3 = *psVar3 + 2;
    lVar5 = *(long *)((long)this->m_pEdges + lVar9 * 4);
    *(undefined4 *)(lVar5 + (ulong)((uVar2 & 0xffff) + 1) * 4) = *(undefined4 *)(lVar5 + lVar8 * 4);
    lVar5 = *(long *)((long)this->m_pEdges + lVar9 * 4);
    *(undefined2 *)(lVar5 + lVar8 * 4) = *(undefined2 *)((long)local_3c + lVar9 + 6);
    *(ushort *)(lVar5 + 2 + lVar8 * 4) = uVar4;
    *(undefined2 *)(lVar5 + (ulong)uVar6 * 4) = *(undefined2 *)((long)local_3c + lVar9);
    *(ushort *)(lVar5 + 2 + (ulong)uVar6 * 4) = uVar4;
    *(short *)((long)(&(pHVar1->super_cbtBroadphaseProxy).m_aabbMax + 1) + lVar9) = (short)iVar7;
    *(ushort *)((long)pHVar1->m_maxEdges + lVar9) = uVar6;
    lVar9 = lVar9 + 2;
  } while (lVar9 != 6);
  sortMinDown(this,0,*(unsigned_short *)&(pHVar1->super_cbtBroadphaseProxy).field_0x34,dispatcher,
              false);
  sortMaxDown(this,0,pHVar1->m_maxEdges[0],dispatcher,false);
  sortMinDown(this,1,*(unsigned_short *)&(pHVar1->super_cbtBroadphaseProxy).field_0x36,dispatcher,
              false);
  sortMaxDown(this,1,pHVar1->m_maxEdges[1],dispatcher,false);
  sortMinDown(this,2,*(unsigned_short *)&pHVar1->field_0x38,dispatcher,true);
  sortMaxDown(this,2,pHVar1->m_maxEdges[2],dispatcher,true);
  return uVar4;
}

Assistant:

BP_FP_INT_TYPE cbtAxisSweep3Internal<BP_FP_INT_TYPE>::addHandle(const cbtVector3& aabbMin, const cbtVector3& aabbMax, void* pOwner, int collisionFilterGroup, int collisionFilterMask, cbtDispatcher* dispatcher)
{
	// quantize the bounds
	BP_FP_INT_TYPE min[3], max[3];
	quantize(min, aabbMin, 0);
	quantize(max, aabbMax, 1);

	// allocate a handle
	BP_FP_INT_TYPE handle = allocHandle();

	Handle* pHandle = getHandle(handle);

	pHandle->m_uniqueId = static_cast<int>(handle);
	//pHandle->m_pOverlaps = 0;
	pHandle->m_clientObject = pOwner;
	pHandle->m_collisionFilterGroup = collisionFilterGroup;
	pHandle->m_collisionFilterMask = collisionFilterMask;

	// compute current limit of edge arrays
	BP_FP_INT_TYPE limit = static_cast<BP_FP_INT_TYPE>(m_numHandles * 2);

	// insert new edges just inside the max boundary edge
	for (BP_FP_INT_TYPE axis = 0; axis < 3; axis++)
	{
		m_pHandles[0].m_maxEdges[axis] += 2;

		m_pEdges[axis][limit + 1] = m_pEdges[axis][limit - 1];

		m_pEdges[axis][limit - 1].m_pos = min[axis];
		m_pEdges[axis][limit - 1].m_handle = handle;

		m_pEdges[axis][limit].m_pos = max[axis];
		m_pEdges[axis][limit].m_handle = handle;

		pHandle->m_minEdges[axis] = static_cast<BP_FP_INT_TYPE>(limit - 1);
		pHandle->m_maxEdges[axis] = limit;
	}

	// now sort the new edges to their correct position
	sortMinDown(0, pHandle->m_minEdges[0], dispatcher, false);
	sortMaxDown(0, pHandle->m_maxEdges[0], dispatcher, false);
	sortMinDown(1, pHandle->m_minEdges[1], dispatcher, false);
	sortMaxDown(1, pHandle->m_maxEdges[1], dispatcher, false);
	sortMinDown(2, pHandle->m_minEdges[2], dispatcher, true);
	sortMaxDown(2, pHandle->m_maxEdges[2], dispatcher, true);

	return handle;
}